

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O3

LinkedSymbol __thiscall
HuffmanTable::getLeastWeightLinkedSymbol
          (HuffmanTable *this,vector<LinkedSymbol,_std::allocator<LinkedSymbol>_> *symbols)

{
  pointer pLVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pLVar4;
  uint uVar5;
  Symbol **ppSVar6;
  pointer __src;
  ulong uVar7;
  Symbol *pSVar8;
  LinkedSymbol LVar9;
  
  pLVar1 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar4 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = (long)pLVar4 - (long)pLVar1 >> 4;
  uVar3 = uVar2 - 1;
  uVar5 = pLVar1[uVar3].weight;
  pSVar8 = pLVar1[uVar3].symbol;
  uVar7 = uVar3;
  if (pLVar4 != pLVar1) {
    ppSVar6 = &pLVar1[uVar2 - 1].symbol;
    do {
      if (((LinkedSymbol *)(ppSVar6 + -1))->weight < uVar5) {
        pSVar8 = *ppSVar6;
        uVar7 = uVar3;
        uVar5 = ((LinkedSymbol *)(ppSVar6 + -1))->weight;
      }
      uVar3 = uVar3 - 1;
      ppSVar6 = ppSVar6 + -2;
    } while (uVar3 < uVar2);
  }
  __src = pLVar1 + uVar7 + 1;
  if (__src != pLVar4) {
    memmove(pLVar1 + uVar7,__src,(long)pLVar4 - (long)__src);
    pLVar4 = (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (symbols->super__Vector_base<LinkedSymbol,_std::allocator<LinkedSymbol>_>)._M_impl.
  super__Vector_impl_data._M_finish = pLVar4 + -1;
  LVar9._4_4_ = 0;
  LVar9.weight = uVar5;
  LVar9.symbol = pSVar8;
  return LVar9;
}

Assistant:

LinkedSymbol getLeastWeightLinkedSymbol(std::vector<LinkedSymbol>& symbols) {
            std::vector<LinkedSymbol>::size_type index = symbols.size() - 1;
            auto minWeight = symbols[index];
            //从底部开始循环
            for(auto i = symbols.size() - 1; i < symbols.size(); i--) {
                if(symbols[i].weight >= minWeight.weight) continue;
                minWeight = symbols[i];
                index = i;
            }
            symbols.erase(symbols.begin() + index);
            return minWeight;
    }